

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O3

void __thiscall
ans_fold_encode<8U>::encode_symbol
          (ans_fold_encode<8U> *this,uint64_t *state,uint32_t sym,uint8_t **out_u8)

{
  pointer peVar1;
  ushort uVar2;
  uint8_t *puVar3;
  pointer peVar4;
  bool bVar5;
  ulong uVar6;
  uint32_t uVar7;
  int iVar8;
  
  iVar8 = 0;
  if (0x7fff < sym) {
    iVar8 = 0;
    uVar6 = (ulong)sym;
    uVar7 = sym;
    do {
      puVar3 = *out_u8;
      iVar8 = iVar8 + 0x7f80;
      *out_u8 = puVar3 + 1;
      *puVar3 = (uint8_t)uVar7;
      sym = (uint32_t)(uVar6 >> 8);
      bVar5 = 0x7fffff < uVar7;
      uVar6 = uVar6 >> 8;
      uVar7 = sym;
    } while (bVar5);
  }
  peVar4 = (this->table).super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar6 = *state;
  peVar1 = peVar4 + (iVar8 + sym);
  if (peVar4[iVar8 + sym].sym_upper_bound <= uVar6) {
    puVar3 = *out_u8;
    *(int *)puVar3 = (int)uVar6;
    uVar6 = uVar6 >> 0x20;
    *out_u8 = puVar3 + 4;
    *state = uVar6;
  }
  uVar2 = peVar1->freq;
  *state = (ulong)peVar1->base + uVar6 % (ulong)uVar2 + (uVar6 / uVar2) * this->frame_size;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint32_t sym, uint8_t*& out_u8)
    {
        auto mapped_sym
            = ans_fold_mapping_and_exceptions<fidelity>(sym, out_u8);
        const auto& e = table[mapped_sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }